

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

StringIntMap * __thiscall
glcts::LayoutBindingProgram::getOffsets(LayoutBindingProgram *this,StringVector *param_2)

{
  _Rb_tree_header *p_Var1;
  StringIntMap *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return in_RDI;
}

Assistant:

virtual StringIntMap getOffsets(StringVector /*args*/) const
	{
		return StringIntMap();
	}